

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O1

void p_error_set_error(PError *error,pint code,pint native_code,pchar *message)

{
  pchar *ppVar1;
  
  if (error != (PError *)0x0) {
    if (error->message != (pchar *)0x0) {
      p_free(error->message);
    }
    error->code = code;
    error->native_code = native_code;
    ppVar1 = p_strdup(message);
    error->message = ppVar1;
  }
  return;
}

Assistant:

P_LIB_API void
p_error_set_error (PError	*error,
		   pint		code,
		   pint		native_code,
		   const pchar	*message)
{
	if (P_UNLIKELY (error == NULL))
		return;

	if (error->message != NULL)
		p_free (error->message);

	error->code        = code;
	error->native_code = native_code;
	error->message     = p_strdup (message);
}